

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O0

uint __thiscall BitStreamReader::getBits(BitStreamReader *this,uint num)

{
  uint uVar1;
  BitStreamException *this_00;
  int local_18;
  uint prevVal;
  uint num_local;
  BitStreamReader *this_local;
  
  if ((num < 0x21) && (num <= (this->super_BitStream).m_totalBits)) {
    local_18 = 0;
    if (this->m_bitLeft < num) {
      if (this->m_bitLeft != 0) {
        local_18 = (this->m_curVal & BitStream::m_masks[this->m_bitLeft]) <<
                   ((char)num - (char)this->m_bitLeft & 0x1fU);
      }
      (this->super_BitStream).m_buffer = (this->super_BitStream).m_buffer + 1;
      uVar1 = getCurVal(this,(this->super_BitStream).m_buffer);
      this->m_curVal = uVar1;
      this->m_bitLeft = (0x20 - num) + this->m_bitLeft;
    }
    else {
      this->m_bitLeft = this->m_bitLeft - num;
    }
    (this->super_BitStream).m_totalBits = (this->super_BitStream).m_totalBits - num;
    return local_18 + (this->m_curVal >> ((byte)this->m_bitLeft & 0x1f)) & BitStream::m_masks[num];
  }
  this_00 = (BitStreamException *)__cxa_allocate_exception(8);
  memset(this_00,0,8);
  BitStreamException::BitStreamException(this_00);
  __cxa_throw(this_00,&BitStreamException::typeinfo,BitStreamException::~BitStreamException);
}

Assistant:

[[nodiscard]] unsigned getBits(const unsigned num)
    {
        if (num > INT_BIT || m_totalBits < num)
            THROW_BITSTREAM_ERR;
        unsigned prevVal = 0;
        if (num <= m_bitLeft)
            m_bitLeft -= num;
        else
        {
            if (m_bitLeft != 0)
                prevVal = (m_curVal & m_masks[m_bitLeft]) << (num - m_bitLeft);
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft += INT_BIT - num;
        }
        m_totalBits -= num;
        return prevVal + (m_curVal >> m_bitLeft) & m_masks[num];
    }